

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CustomOptions_Test::
AllowUnknownDependenciesTest_CustomOptions_Test
          (AllowUnknownDependenciesTest_CustomOptions_Test *this)

{
  AllowUnknownDependenciesTest_CustomOptions_Test *this_local;
  
  AllowUnknownDependenciesTest::AllowUnknownDependenciesTest
            (&this->super_AllowUnknownDependenciesTest);
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .super_Test._vptr_Test =
       (_func_int **)&PTR__AllowUnknownDependenciesTest_CustomOptions_Test_029a7a30;
  (this->super_AllowUnknownDependenciesTest).
  super_TestWithParam<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  .
  super_WithParamInterface<std::tuple<google::protobuf::descriptor_unittest::DescriptorPoolMode,_const_char_*>_>
  ._vptr_WithParamInterface =
       (_func_int **)&PTR__AllowUnknownDependenciesTest_CustomOptions_Test_029a7a70;
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CustomOptions) {
  // Moo should still have the uninterpreted option attached.
  ASSERT_EQ(1, moo_field_->options().uninterpreted_option_size());
  const UninterpretedOption& option =
      moo_field_->options().uninterpreted_option(0);
  ASSERT_EQ(1, option.name_size());
  EXPECT_EQ("grault", option.name(0).name_part());
}